

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall QGridLayoutPrivate::setupHfwLayoutData(QGridLayoutPrivate *this)

{
  long lVar1;
  QGridBox *pQVar2;
  QGridBox *this_00;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  bool bVar6;
  int iVar7;
  int stretch;
  int iVar8;
  int iVar9;
  reference pQVar10;
  const_reference piVar11;
  QList<int> *stretchArray;
  qsizetype qVar12;
  const_reference ppQVar13;
  const_reference pQVar14;
  QList<QLayoutStruct> *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int hfwh;
  int w;
  int c2;
  int r2;
  int c1;
  int r1;
  QGridBox *box;
  int i_1;
  int pass;
  int i;
  QList<QLayoutStruct> *rData;
  QSize min;
  QSize hint;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QGridBox *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  byte bVar15;
  QGridBox *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int iVar16;
  int in_stack_ffffffffffffff5c;
  const_reference in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int local_5c;
  int local_34;
  int local_30;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QGridBox *)in_RDI[9].d.size;
  for (local_2c = 0; local_2c < *(int *)&in_RDI[7].d.ptr; local_2c = local_2c + 1) {
    in_stack_ffffffffffffff88 =
         QList<QLayoutStruct>::at
                   ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar10 = QList<QLayoutStruct>::operator[]
                        ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    iVar16 = in_stack_ffffffffffffff88->sizeHint;
    pQVar10->stretch = in_stack_ffffffffffffff88->stretch;
    pQVar10->sizeHint = iVar16;
    iVar16 = in_stack_ffffffffffffff88->minimumSize;
    pQVar10->maximumSize = in_stack_ffffffffffffff88->maximumSize;
    pQVar10->minimumSize = iVar16;
    bVar6 = in_stack_ffffffffffffff88->expansive;
    bVar3 = in_stack_ffffffffffffff88->empty;
    bVar4 = in_stack_ffffffffffffff88->done;
    uVar5 = in_stack_ffffffffffffff88->field_0x17;
    pQVar10->spacing = in_stack_ffffffffffffff88->spacing;
    pQVar10->expansive = bVar6;
    pQVar10->empty = bVar3;
    pQVar10->done = bVar4;
    pQVar10->field_0x17 = uVar5;
    iVar16 = in_stack_ffffffffffffff88->size;
    pQVar10->pos = in_stack_ffffffffffffff88->pos;
    pQVar10->size = iVar16;
    piVar11 = QList<int>::at((QList<int> *)in_stack_ffffffffffffff40,
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    in_stack_ffffffffffffff94 = *piVar11;
    pQVar10 = QList<QLayoutStruct>::operator[]
                        ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar10->sizeHint = in_stack_ffffffffffffff94;
    pQVar10 = QList<QLayoutStruct>::operator[]
                        ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar10->minimumSize = in_stack_ffffffffffffff94;
  }
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    local_34 = 0;
    while( true ) {
      stretchArray = (QList<int> *)(long)local_34;
      qVar12 = QList<QGridBox_*>::size((QList<QGridBox_*> *)(in_RDI + 0xe));
      if (qVar12 <= (long)stretchArray) break;
      ppQVar13 = QList<QGridBox_*>::at
                           ((QList<QGridBox_*> *)in_stack_ffffffffffffff40,
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      this_00 = *ppQVar13;
      iVar16 = this_00->row;
      iVar7 = QGridBox::toRow(this_00,*(int *)&in_RDI[7].d.ptr);
      stretch = QGridBox::toCol(this_00,*(int *)((long)&in_RDI[7].d.ptr + 4));
      QList<QLayoutStruct>::at
                ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QList<QLayoutStruct>::at
                ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      QList<QLayoutStruct>::at
                ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (iVar16 == iVar7) {
        if (local_30 == 0) {
          addHfwData((QGridLayoutPrivate *)
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        }
      }
      else if (local_30 == 0) {
        initEmptyMultiBox((QList<QLayoutStruct> *)in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
      else {
        QGridBox::sizeHint((QGridBox *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                          );
        QGridBox::minimumSize
                  ((QGridBox *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        bVar6 = QGridBox::hasHeightForWidth((QGridBox *)0x3322c6);
        if (bVar6) {
          iVar8 = QGridBox::heightForWidth(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          iVar9 = QSize::height((QSize *)0x3322f6);
          if (iVar9 < iVar8) {
            QSize::setHeight((QSize *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          }
          iVar9 = QSize::height((QSize *)0x332326);
          if (iVar9 < iVar8) {
            QSize::setHeight((QSize *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          }
        }
        in_stack_ffffffffffffff50 = pQVar2;
        QSize::height((QSize *)0x332370);
        QSize::height((QSize *)0x332381);
        in_stack_ffffffffffffff38 = QGridBox::vStretch(in_stack_ffffffffffffff40);
        distributeMultiBox(in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                           (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                           (int)in_stack_ffffffffffffff88,stretchArray,stretch);
        in_stack_ffffffffffffff58 = iVar16;
        in_stack_ffffffffffffff5c = iVar7;
      }
      local_34 = local_34 + 1;
    }
  }
  for (local_5c = 0; local_5c < *(int *)&in_RDI[7].d.ptr; local_5c = local_5c + 1) {
    pQVar14 = QList<QLayoutStruct>::at
                        ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar15 = true;
    if ((pQVar14->expansive & 1U) == 0) {
      pQVar14 = QList<QLayoutStruct>::at
                          ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar15 = 0 < pQVar14->stretch;
    }
    pQVar10 = QList<QLayoutStruct>::operator[]
                        ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                         CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    pQVar10->expansive = (bool)(bVar15 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGridLayoutPrivate::setupHfwLayoutData()
{
    QList<QLayoutStruct> &rData = *hfwData;
    for (int i = 0; i < rr; i++) {
        rData[i] = rowData.at(i);
        rData[i].minimumSize = rData[i].sizeHint = rMinHeights.at(i);
    }

    for (int pass = 0; pass < 2; ++pass) {
        for (int i = 0; i < things.size(); ++i) {
            QGridBox *box = things.at(i);
            int r1 = box->row;
            int c1 = box->col;
            int r2 = box->toRow(rr);
            int c2 = box->toCol(cc);
            int w = colData.at(c2).pos + colData.at(c2).size - colData.at(c1).pos;

            if (r1 == r2) {
                if (pass == 0)
                    addHfwData(box, w);
            } else {
                if (pass == 0) {
                    initEmptyMultiBox(rData, r1, r2);
                } else {
                    QSize hint = box->sizeHint();
                    QSize min = box->minimumSize();
                    if (box->hasHeightForWidth()) {
                        int hfwh = box->heightForWidth(w);
                        if (hfwh > hint.height())
                            hint.setHeight(hfwh);
                        if (hfwh > min.height())
                            min.setHeight(hfwh);
                    }
                    distributeMultiBox(rData, r1, r2, min.height(), hint.height(),
                                       rStretch, box->vStretch());
                }
            }
        }
    }
    for (int i = 0; i < rr; i++)
        rData[i].expansive = rData.at(i).expansive || rData.at(i).stretch > 0;
}